

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeString::doLastIndexOf(UnicodeString *this,UChar32 c,int32_t start,int32_t length)

{
  char16_t *pcVar1;
  UChar *pUVar2;
  UChar *match;
  UChar *array;
  int32_t local_20;
  int32_t length_local;
  int32_t start_local;
  UChar32 c_local;
  UnicodeString *this_local;
  
  array._4_4_ = length;
  local_20 = start;
  length_local = c;
  _start_local = this;
  pinIndices(this,&local_20,(int32_t *)((long)&array + 4));
  pcVar1 = getArrayStart(this);
  pUVar2 = u_memrchr32_63(pcVar1 + local_20,length_local,array._4_4_);
  if (pUVar2 == (UChar *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = (int32_t)((long)pUVar2 - (long)pcVar1 >> 1);
  }
  return this_local._4_4_;
}

Assistant:

int32_t
UnicodeString::doLastIndexOf(UChar32 c,
                             int32_t start,
                             int32_t length) const {
  // pin indices
  pinIndices(start, length);

  // find the last occurrence of c
  const UChar *array = getArrayStart();
  const UChar *match = u_memrchr32(array + start, c, length);
  if(match == NULL) {
    return -1;
  } else {
    return (int32_t)(match - array);
  }
}